

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O2

uint32_t find_min<float>(vector<float,_std::allocator<float>_> *arr)

{
  float fVar1;
  pointer pfVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  
  pfVar2 = (arr->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar3 = 0;
  fVar6 = 3.4028235e+38;
  for (uVar4 = 0; uVar5 = (ulong)uVar4,
      uVar5 < (ulong)((long)(arr->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pfVar2 >> 2);
      uVar4 = uVar4 + 1) {
    fVar1 = pfVar2[uVar5];
    if (fVar6 <= fVar1) {
      fVar1 = fVar6;
      uVar5 = uVar3;
    }
    uVar3 = uVar5;
    fVar6 = fVar1;
  }
  return (uint32_t)uVar3;
}

Assistant:

uint32_t find_min(vector<T> arr)
{
	T min_val = FLT_MAX;
	uint32_t argmin = 0;

	for (uint32_t i = 0; i < arr.size(); i++)
	{
		if (arr[i] < min_val)
		{
			min_val = arr[i];
			argmin = i;
		}
	}
	return argmin;
}